

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.hpp
# Opt level: O2

bool fmt::impl::parse_integer<char,long>(char **format,long *val)

{
  byte *pbVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  
  lVar2 = 0;
  pbVar1 = (byte *)*format;
  while( true ) {
    bVar4 = *pbVar1 - 0x3a;
    if (bVar4 < 0xf6) break;
    if (0xccccccccccccccc < lVar2) goto LAB_0014354a;
    lVar2 = lVar2 * 10;
    uVar3 = (ulong)(*pbVar1 & 0xf);
    uVar5 = uVar3 ^ 0x7fffffffffffffff;
    if (lVar2 - uVar5 != 0 && (long)uVar5 <= lVar2) goto LAB_0014354a;
    *format = (char *)(pbVar1 + 1);
    lVar2 = lVar2 + uVar3;
    pbVar1 = pbVar1 + 1;
  }
  *val = lVar2;
LAB_0014354a:
  return bVar4 < 0xf6;
}

Assistant:

bool parse_integer(const CharT*& format, T& val) {
   T v{};
   CharT ch = *format;
   constexpr T maxval = std::numeric_limits<T>::max();
   constexpr T maxval10 = maxval / 10;
   while (ch >= '0' && ch <= '9') {
      T digit = ch - '0';
      if (v > maxval10) return false;
      v *= 10;
      if (v > maxval - digit) return false;
      v += digit;
      ch = *++format;
   }
   val = v;
   return true;
}